

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_c.cpp
# Opt level: O0

void caxpy(int n,complex<float> ca,complex<float> *cx,int incx,complex<float> *cy,int incy)

{
  complex<float> *pcVar1;
  undefined4 in_register_0000000c;
  undefined4 in_register_0000003c;
  complex<float> z;
  float fVar2;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  complex<float> local_68 [2];
  complex<float> local_58 [3];
  int local_40;
  int local_3c;
  int iy;
  int ix;
  int i;
  int incy_local;
  complex<float> *cy_local;
  complex<float> cStack_20;
  int incx_local;
  complex<float> *cx_local;
  int n_local;
  complex<float> ca_local;
  
  ix = (int)cy;
  z._M_value._4_4_ = in_register_0000003c;
  z._M_value._0_4_ = n;
  _i = CONCAT44(in_register_0000000c,incx);
  cy_local._4_4_ = (int)cx;
  if (0 < n) {
    cStack_20._M_value = ca._M_value;
    cx_local._4_4_ = n;
    fVar2 = cabs1(z);
    if ((fVar2 != 0.0) || (NAN(fVar2))) {
      if ((cy_local._4_4_ == 1) && (ix == 1)) {
        for (iy = 0; iy < cx_local._4_4_; iy = iy + 1) {
          pcVar1 = (complex<float> *)(_i + (long)iy * 8);
          std::operator*((complex<float> *)&stack0xfffffffffffffff0,
                         (complex<float> *)(cStack_20._M_value + (long)iy * 8));
          std::operator+(pcVar1,local_68);
          *(undefined8 *)(_i + (long)iy * 8) = extraout_XMM0_Qa_00;
        }
      }
      else {
        if (cy_local._4_4_ < 0) {
          local_3c = (1 - cx_local._4_4_) * cy_local._4_4_;
        }
        else {
          local_3c = 0;
        }
        if (ix < 0) {
          local_40 = (1 - cx_local._4_4_) * ix;
        }
        else {
          local_40 = 0;
        }
        for (iy = 0; iy < cx_local._4_4_; iy = iy + 1) {
          pcVar1 = (complex<float> *)(_i + (long)local_40 * 8);
          std::operator*((complex<float> *)&stack0xfffffffffffffff0,
                         (complex<float> *)(cStack_20._M_value + (long)local_3c * 8));
          std::operator+(pcVar1,local_58);
          *(undefined8 *)(_i + (long)local_40 * 8) = extraout_XMM0_Qa;
          local_3c = local_3c + cy_local._4_4_;
          local_40 = local_40 + ix;
        }
      }
    }
  }
  return;
}

Assistant:

void caxpy ( int n, complex <float> ca, complex <float> cx[],
  int incx, complex <float> cy[], int incy )

//****************************************************************************80
//
//  Purpose:
//
//    CAXPY computes a constant times a vector plus a vector.
//
//  Discussion:
//
//    This routine uses single precision complex arithmetic.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    10 April 2006
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Jim Bunch, Cleve Moler, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of elements in CX and CY.
//
//    Input, complex <float> CA, the multiplier of CX.
//
//    Input, complex <float> CX[], the first vector.
//
//    Input, int INCX, the increment between successive entries of CX.
//
//    Input/output, complex <float> CY[], the second vector.
//    On output, CY(*) has been replaced by CY(*) + CA * CX(*).
//
//    Input, int INCY, the increment between successive entries of CY.
//
{
  int i;
  int ix;
  int iy;

  if ( n <= 0 )
  {
    return;
  }

  if ( cabs1 ( ca ) == 0.0 )
  {
    return;
  }

  if ( incx != 1 || incy != 1 )
  {
    if ( 0 <= incx )
    {
      ix = 0;
    }
    else
    {
      ix = ( -n + 1 ) * incx;
    }

    if ( 0 <= incy )
    {
      iy = 0;
    }
    else
    {
      iy = ( -n + 1 ) * incy;
    }

    for ( i = 0; i < n; i++ )
    {
      cy[iy] = cy[iy] + ca * cx[ix];
      ix = ix + incx;
      iy = iy + incy;
    }
  }
  else
  {
    for ( i = 0; i < n; i++ )
    {
      cy[i] = cy[i] + ca * cx[i];
    }

  }

  return;
}